

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end,int server_preference,int server_chacha_priority,
                 ptls_hash_algorithm_t *hash)

{
  bool bVar1;
  int iVar2;
  size_t found_index;
  ulong uVar3;
  ulong uVar4;
  ushort unaff_BP;
  long lVar5;
  ulong uVar6;
  ptls_cipher_suite_t *ppVar7;
  char cVar8;
  
  uVar3 = 0xffffffffffffffff;
  do {
    uVar4 = uVar3;
    if (src == end) goto LAB_0011bf48;
    lVar5 = (long)end - (long)src;
    iVar2 = 0x32;
    if (1 < lVar5) {
      unaff_BP = *(ushort *)src << 8 | *(ushort *)src >> 8;
      src = (uint8_t *)((long)src + 2);
      iVar2 = 0;
    }
    cVar8 = '\x04';
    if (1 < lVar5) {
      ppVar7 = *candidates;
      bVar1 = true;
      if (ppVar7 != (ptls_cipher_suite_t *)0x0) {
        uVar6 = 0;
        do {
          if ((ppVar7->id == unaff_BP) &&
             ((hash == (ptls_hash_algorithm_t *)0x0 || (ppVar7->hash == hash)))) {
            if (unaff_BP == 0x1303 && server_chacha_priority != 0 || server_preference == 0) {
              *selected = ppVar7;
              bVar1 = false;
              uVar4 = uVar3;
              break;
            }
            uVar4 = uVar6;
            if (uVar6 < uVar3) break;
          }
          ppVar7 = candidates[uVar6 + 1];
          uVar6 = uVar6 + 1;
          uVar4 = uVar3;
        } while (ppVar7 != (ptls_cipher_suite_t *)0x0);
      }
      if (bVar1) {
        if (uVar4 != 0) {
          server_chacha_priority = 0;
        }
        cVar8 = (uVar4 == 0) * '\x03';
      }
    }
    uVar3 = uVar4;
  } while (cVar8 == '\0');
  if (cVar8 == '\x03') {
LAB_0011bf48:
    if (uVar4 == 0xffffffffffffffff) {
      iVar2 = 0x28;
    }
    else {
      *selected = candidates[uVar4];
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end, int server_preference, int server_chacha_priority, ptls_hash_algorithm_t *hash)
{
    size_t found_index = SIZE_MAX;
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        for (size_t i = 0; candidates[i] != NULL; ++i) {
            if (candidates[i]->id == id && (hash == NULL || candidates[i]->hash == hash)) {
                if (server_preference && !(server_chacha_priority && id == PTLS_CIPHER_SUITE_CHACHA20_POLY1305_SHA256)) {
                    /* preserve smallest matching index, and proceed to the next input */
                    if (i < found_index) {
                        found_index = i;
                        break;
                    }
                } else {
                    /* return the pointer matching to the first input that can be used */
                    *selected = candidates[i];
                    goto Exit;
                }
            }
        }
        /* first position of the server list matched (server_preference) */
        if (found_index == 0)
            break;
        /* server preference is overridden only if the first entry of client-provided list is chachapoly */
        server_chacha_priority = 0;
    }
    if (found_index != SIZE_MAX) {
        *selected = candidates[found_index];
        ret = 0;
    } else {
        ret = PTLS_ALERT_HANDSHAKE_FAILURE;
    }

Exit:
    return ret;
}